

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O3

unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
 __thiscall
HawkTracer::parser::
make_unique<HawkTracer::parser::EventKlassField,char_const(&)[17],char_const(&)[12],HawkTracer::parser::FieldTypeId>
          (parser *this,char (*args) [17],char (*args_1) [12],FieldTypeId *args_2)

{
  EventKlassField *this_00;
  size_t sVar1;
  shared_ptr<const_HawkTracer::parser::EventKlass> local_88;
  string local_70;
  string local_50;
  
  this_00 = (EventKlassField *)operator_new(0x58);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,args,*args + sVar1);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar1 = strlen(*args_1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,args_1,*args_1 + sVar1);
  local_88.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  EventKlassField::EventKlassField(this_00,&local_50,&local_70,*args_2,&local_88);
  *(EventKlassField **)this = this_00;
  if (local_88.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}